

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::StoreResult<char_const*>
               (OutType infoType,cmMakefile *makefile,string *variable,char *value)

{
  char *local_60;
  string_view local_48;
  string_view local_38;
  char *local_28;
  char *value_local;
  string *variable_local;
  cmMakefile *makefile_local;
  OutType infoType_local;
  
  local_28 = value;
  value_local = (char *)variable;
  variable_local = (string *)makefile;
  makefile_local._4_4_ = infoType;
  if (infoType == OutSet) {
    if (value == (char *)0x0) {
      local_60 = "0";
    }
    else {
      local_60 = "1";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,local_60);
    cmMakefile::AddDefinition(makefile,variable,local_38);
  }
  else if (value == (char *)0x0) {
    cmMakefile::RemoveDefinition(makefile,variable);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,value);
    cmMakefile::AddDefinition(makefile,variable,local_48);
  }
  return true;
}

Assistant:

bool StoreResult(OutType infoType, cmMakefile& makefile,
                 const std::string& variable, ValueType value)
{
  if (infoType == OutSet) {
    makefile.AddDefinition(variable, value ? "1" : "0");
  } else // if(infoType == OutValue)
  {
    if (value) {
      makefile.AddDefinition(variable, value);
    } else {
      makefile.RemoveDefinition(variable);
    }
  }
  return true;
}